

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

void __thiscall
JsUtil::
BaseDictionary<Js::NumberTrio,_Js::NumberTrio,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
::Resize(BaseDictionary<Js::NumberTrio,_Js::NumberTrio,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
         *this)

{
  ulong uVar1;
  uint newSize;
  ImplicitKeyValueEntry<Js::NumberTrio,_Js::NumberTrio> *pIVar2;
  uint uVar3;
  hash_t hVar4;
  SimpleHashedEntry<Js::NumberTrio,_Js::NumberTrio> *pSVar5;
  size_t byteSize;
  size_t dstCount;
  long lVar6;
  long lVar7;
  int *local_48;
  int *newBuckets;
  SimpleHashedEntry<Js::NumberTrio,_Js::NumberTrio> *pSStack_38;
  int modIndex;
  EntryType *newEntries;
  
  newSize = this->count * 2;
  newBuckets._4_4_ = 0x4b;
  uVar3 = 4;
  if (8 < newSize) {
    uVar3 = this->count & 0x7fffffff;
  }
  uVar3 = PrimePolicy::GetPrime(uVar3,(int *)((long)&newBuckets + 4));
  local_48 = (Type)0x0;
  pSStack_38 = (SimpleHashedEntry<Js::NumberTrio,_Js::NumberTrio> *)0x0;
  dstCount = (size_t)(int)newSize;
  if (uVar3 == this->bucketCount) {
    byteSize = 0xffffffffffffffff;
    if (-1 < (int)newSize) {
      byteSize = dstCount * 0x10;
    }
    pSStack_38 = (SimpleHashedEntry<Js::NumberTrio,_Js::NumberTrio> *)
                 Memory::NoCheckHeapAllocator::AllocZero(this->alloc,byteSize);
    if (newSize != 0) {
      pSVar5 = pSStack_38;
      do {
        pIVar2 = &(pSVar5->
                  super_DefaultHashedEntry<Js::NumberTrio,_Js::NumberTrio,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                  ).super_ImplicitKeyValueEntry<Js::NumberTrio,_Js::NumberTrio>;
        (pIVar2->
        super_ValueEntry<Js::NumberTrio,_JsUtil::(anonymous_namespace)::ValueEntryData<Js::NumberTrio>_>
        ).super_ValueEntryData<Js::NumberTrio>.value.x = 0xffffffff;
        (pIVar2->
        super_ValueEntry<Js::NumberTrio,_JsUtil::(anonymous_namespace)::ValueEntryData<Js::NumberTrio>_>
        ).super_ValueEntryData<Js::NumberTrio>.value.y = 0xffffffff;
        pSVar5 = pSVar5 + 1;
      } while (pSVar5 != pSStack_38 + dstCount);
    }
    Memory::
    CopyArray<JsUtil::SimpleHashedEntry<Js::NumberTrio,Js::NumberTrio>,Js::NumberTrio,Memory::NoCheckHeapAllocator>
              (pSStack_38,dstCount,this->entries,(long)this->count);
    DeleteEntries(this,this->entries,this->size);
    this->entries = pSStack_38;
    this->size = newSize;
    this->modFunctionIndex = newBuckets._4_4_;
  }
  else {
    Allocate(this,&local_48,&stack0xffffffffffffffc8,uVar3,newSize);
    Memory::
    CopyArray<JsUtil::SimpleHashedEntry<Js::NumberTrio,Js::NumberTrio>,Js::NumberTrio,Memory::NoCheckHeapAllocator>
              (pSStack_38,dstCount,this->entries,(long)this->count);
    this->modFunctionIndex = newBuckets._4_4_;
    if (0 < this->count) {
      lVar6 = 0xc;
      lVar7 = 0;
      do {
        if (-2 < *(int *)((long)&(pSStack_38->
                                 super_DefaultHashedEntry<Js::NumberTrio,_Js::NumberTrio,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                                 ).super_ImplicitKeyValueEntry<Js::NumberTrio,_Js::NumberTrio>.
                                 super_ValueEntry<Js::NumberTrio,_JsUtil::(anonymous_namespace)::ValueEntryData<Js::NumberTrio>_>
                                 .super_ValueEntryData<Js::NumberTrio>.value.x + lVar6)) {
          uVar1 = *(ulong *)((long)pSStack_38 + lVar6 + -0xc);
          hVar4 = PrimePolicy::ModPrime
                            ((int)uVar1 * 0x100000 + *(int *)((long)pSStack_38 + lVar6 + -4) +
                             ((uint)(uVar1 >> 0x16) & 0x7ffffc00) & 0x7fffffff,uVar3,
                             this->modFunctionIndex);
          *(int *)((long)&(pSStack_38->
                          super_DefaultHashedEntry<Js::NumberTrio,_Js::NumberTrio,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                          ).super_ImplicitKeyValueEntry<Js::NumberTrio,_Js::NumberTrio>.
                          super_ValueEntry<Js::NumberTrio,_JsUtil::(anonymous_namespace)::ValueEntryData<Js::NumberTrio>_>
                          .super_ValueEntryData<Js::NumberTrio>.value.x + lVar6) =
               local_48[(int)hVar4];
          local_48[(int)hVar4] = (int)lVar7;
        }
        lVar7 = lVar7 + 1;
        lVar6 = lVar6 + 0x10;
      } while (lVar7 < this->count);
    }
    DeleteBuckets(this,this->buckets,this->bucketCount);
    DeleteEntries(this,this->entries,this->size);
    if (this->stats != (DictionaryStats *)0x0) {
      DictionaryStats::Resize(this->stats,newSize,newSize - this->size);
    }
    this->buckets = local_48;
    this->entries = pSStack_38;
    this->bucketCount = uVar3;
    this->size = newSize;
  }
  return;
}

Assistant:

void Resize()
        {
            AutoDoResize autoDoResize(*this);

            int newSize = SizePolicy::GetNextSize(count);
            int modIndex = UNKNOWN_MOD_INDEX;
            uint newBucketCount = SizePolicy::GetBucketSize(newSize, &modIndex);

            __analysis_assume(newSize > count);
            int* newBuckets = nullptr;
            EntryType* newEntries = nullptr;
            if (newBucketCount == bucketCount)
            {
                // no need to rehash
                newEntries = AllocateEntries(newSize);
                CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                    newEntries, newSize, entries, count);

                DeleteEntries(entries, size);

                this->entries = newEntries;
                this->size = newSize;
                this->modFunctionIndex = modIndex;
                return;
            }

            Allocate(&newBuckets, &newEntries, newBucketCount, newSize);
            CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                newEntries, newSize, entries, count);

            // When TAllocator is of type Recycler, it is possible that the Allocate above causes a collection, which
            // in turn can cause entries in the dictionary to be removed - i.e. the dictionary contains weak references
            // that remove themselves when no longer valid. This means the free list might not be empty anymore.
            this->modFunctionIndex = modIndex;
            for (int i = 0; i < count; i++)
            {
                __analysis_assume(i < newSize);

                if (!IsFreeEntry(newEntries[i]))
                {
                    hash_t hashCode = newEntries[i].template GetHashCode<Comparer<TKey>>();
                    int bucket = GetBucket(hashCode, newBucketCount, modFunctionIndex);
                    newEntries[i].next = newBuckets[bucket];
                    newBuckets[bucket] = i;
                }
            }

            DeleteBuckets(buckets, bucketCount);
            DeleteEntries(entries, size);

#if PROFILE_DICTIONARY
            if (stats)
                stats->Resize(newSize, /*emptyBuckets=*/ newSize - size);
#endif
            this->buckets = newBuckets;
            this->entries = newEntries;
            bucketCount = newBucketCount;
            size = newSize;
        }